

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O3

void av1_update_and_record_txb_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  short *psVar1;
  tran_low_t *__dest;
  int *piVar2;
  byte bVar3;
  TX_CLASS tx_class;
  short sVar4;
  long lVar5;
  long lVar6;
  int16_t *scan;
  undefined1 auVar7 [14];
  short sVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  char cVar22;
  byte bVar23;
  TxSetType TVar24;
  uint uVar25;
  tran_low_t *qcoeff;
  ulong uVar26;
  long lVar27;
  size_t __n;
  int iVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  SCAN_ORDER *scan_order;
  ushort *puVar32;
  char cVar33;
  byte bVar34;
  ushort uVar35;
  long lVar36;
  aom_cdf_prob *cdf;
  int iVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  undefined7 in_register_00000089;
  long lVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  ushort uVar46;
  byte *pbVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  undefined1 auVar54 [16];
  ushort uVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte local_15f4;
  TXB_CTX txb_ctx;
  uint8_t levels_buf [1312];
  int8_t coeff_contexts [4096];
  
  uVar20 = CONCAT71(in_register_00000089,tx_size) & 0xffffffff;
  lVar5 = *(long *)((long)arg + 8);
  lVar31 = (long)plane;
  lVar42 = (long)block;
  lVar19 = **(long **)(lVar5 + 0x2058);
  uVar46 = *(ushort *)(*(long *)(lVar5 + 0x20 + lVar31 * 0x88) + lVar42 * 2);
  lVar30 = *arg;
  bVar12 = *(byte *)(lVar5 + 0x1b0 + lVar31 * 0xa30);
  uVar16 = (ulong)bVar12;
  if ((*(int *)(lVar5 + 0x2b64 + (ulong)(*(ushort *)(lVar19 + 0xa7) & 7) * 4) == 0) &&
     ((0x61810UL >> ((ulong)tx_size & 0x3f) & 1) == 0)) {
    if (uVar16 == 0) {
      bVar23 = *(byte *)(*(long *)(lVar5 + 0x2088) +
                        (long)(*(int *)(lVar5 + 0x2090) * blk_row + blk_col));
    }
    else {
      cVar33 = (char)*(ushort *)(lVar19 + 0xa7);
      if ((cVar33 < '\0') || ('\0' < *(char *)(lVar19 + 0x10))) {
        bVar23 = *(byte *)(*(long *)(lVar5 + 0x2088) +
                          (long)((blk_row << (*(byte *)(lVar5 + 0x1b8 + uVar16 * 0xa30) & 0x1f)) *
                                 *(int *)(lVar5 + 0x2090) +
                                (blk_col << (*(byte *)(lVar5 + 0x1b4 + uVar16 * 0xa30) & 0x1f))));
        uVar25 = 1;
        if (-1 < cVar33) {
          uVar25 = (uint)('\0' < *(char *)(lVar19 + 0x10));
        }
      }
      else {
        bVar23 = intra_mode_to_tx_type__intra_mode_to_tx_type
                 [(byte)get_uv_mode_uv2y[*(byte *)(lVar19 + 3)]];
        uVar25 = 0;
      }
      if ((0x18608UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
        if (*(char *)(lVar30 + 0x3c175) == '\0') {
          bVar34 = av1_ext_tx_set_lookup[0]
                   [(ulong)((0x60604UL >> ((ulong)tx_size & 0x3f) & 1) != 0) + (ulong)(uVar25 * 2)];
        }
        else {
          bVar34 = (uVar25 == 0) + 1;
        }
        uVar25 = (uint)bVar34;
      }
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)bVar23 * 4 + (ulong)(uVar25 << 6)) == 0) {
        bVar23 = 0;
      }
    }
  }
  else {
    bVar23 = 0;
  }
  lVar27 = lVar31 * 0xa30 + lVar5;
  uVar29 = (ulong)bVar23;
  iVar40 = (int)CONCAT71(in_register_00000089,tx_size);
  scan_order = (SCAN_ORDER *)((long)&av1_scan_orders[0][bVar23].scan + (ulong)(uint)(iVar40 << 8));
  bVar23 = (byte)uVar20;
  qcoeff = (tran_low_t *)((long)(block << 4) * 4 + *(long *)(lVar5 + 0x10 + lVar31 * 0x88));
  uVar25 = (uint)uVar46;
  if (*(char *)((long)arg + 0x15) == '\0') {
    get_txb_ctx(plane_bsize,bVar23,plane,
                (ENTROPY_CONTEXT *)((long)blk_col + *(long *)(lVar27 + 0x220)),
                (ENTROPY_CONTEXT *)((long)blk_row + *(long *)(lVar27 + 0x228)),&txb_ctx);
    uVar17 = 10;
    iVar41 = 0x20;
    uVar14 = (uint)tx_size;
    if (tx_size < 0x11) {
      uVar26 = 3;
      if ((1 < uVar14 - 0xb) && (uVar14 != 4)) {
LAB_001bc41e:
        uVar26 = uVar20;
      }
      local_15f4 = (byte)tx_size_high_log2[uVar26];
      uVar13 = (uint)tx_size;
      if (tx_size < 0x11) {
        uVar26 = 3;
        if ((1 < uVar13 - 0xb) && (uVar14 != 4)) {
          uVar26 = uVar20;
        }
      }
      else {
        if (uVar13 == 0x11) goto LAB_001bc484;
        uVar26 = uVar20;
        if (uVar14 == 0x12) goto LAB_001bc4d4;
      }
      iVar41 = tx_size_wide[uVar26];
      if (tx_size < 0x11) {
        uVar17 = 3;
        if ((1 < uVar13 - 0xb) && (uVar13 != 4)) {
LAB_001bc4ca:
          uVar17 = uVar20;
        }
      }
      else if (uVar13 == 0x11) {
        uVar17 = 9;
      }
      else if (uVar13 != 0x12) goto LAB_001bc4ca;
    }
    else {
      local_15f4 = 5;
      if (uVar14 == 0x11) {
LAB_001bc484:
        uVar17 = 9;
        iVar41 = 0x10;
      }
      else {
        local_15f4 = 4;
        if (uVar14 != 0x12) goto LAB_001bc41e;
      }
    }
LAB_001bc4d4:
    iVar28 = tx_size_high[uVar17];
    cVar33 = *(char *)((long)arg + 0x14);
    bVar34 = ""[uVar20];
    bVar3 = ""[uVar20];
    uVar13 = (uint)bVar3 + (uint)bVar34 + 1 >> 1;
    uVar44 = uVar13 & 0xff;
    lVar6 = *(long *)(lVar5 + 0x2b38);
    if (cVar33 != '\0') {
      puVar32 = (ushort *)((ulong)uVar44 * 0x4e + lVar6 + (long)txb_ctx.txb_skip_ctx * 6);
      uVar35 = puVar32[2];
      bVar21 = (char)(uVar35 >> 4) + 4;
      uVar55 = *puVar32;
      if (uVar46 == 0) {
        sVar4 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar21 & 0x1f));
      }
      else {
        sVar4 = -(uVar55 >> (bVar21 & 0x1f));
      }
      *puVar32 = uVar55 + sVar4;
      puVar32[2] = uVar35 + (uVar35 < 0x20);
    }
    lVar39 = *(long *)(lVar5 + 0x4190);
    uVar17 = (ulong)(*(ushort *)(*(long *)(lVar5 + 0x4178) + 0x4e + uVar16 * 2) >> 4);
    lVar38 = *(long *)(lVar39 + 0x18 + lVar31 * 8);
    lVar36 = uVar17 + *(long *)(lVar39 + 0x30 + lVar31 * 8);
    *(char *)(lVar42 + lVar36) = (char)txb_ctx.txb_skip_ctx;
    *(ushort *)(uVar17 * 2 + lVar38 + lVar42 * 2) = uVar46;
    if (uVar46 == 0) {
      uVar25 = 0;
      goto LAB_001bd1fb;
    }
    if (((0xc < bVar23) || (__n = 0x1000, (0x1810U >> (uVar14 & 0x1f) & 1) == 0)) &&
       (__n = 0x800, 1 < (byte)(tx_size - 0x11))) {
      __n = (long)tx_size_2d[uVar20] << 2;
    }
    if ((*(char *)(lVar30 + 0x409b8) != '\0') &&
       ((*(uint *)(lVar30 + 0x40a3c + (ulong)(*(ushort *)(lVar19 + 0xa7) & 7) * 4) & 0x40) != 0)) {
      __n = 0;
    }
    __dest = (tran_low_t *)
             ((ulong)*(ushort *)(*(long *)(lVar5 + 0x4178) + 0x4e + uVar16 * 2) * 4 +
              *(long *)(lVar39 + lVar31 * 8) + (long)(block << 4) * 4);
    memcpy(__dest,qcoeff,__n);
    (*av1_txb_init_levels)(__dest,iVar41,iVar28,levels_buf);
    lVar19 = **(long **)(lVar5 + 0x2058);
    uVar14 = 1;
    if (-1 < (char)*(ushort *)(lVar19 + 0xa7)) {
      uVar14 = (uint)('\0' < *(char *)(lVar19 + 0x10));
    }
    if (plane < 1) {
      bVar21 = *(byte *)(lVar30 + 0x3c175);
      lVar31 = *(long *)(lVar5 + 0x2b38);
      uVar17 = 0x61810L >> (bVar23 & 0x3f);
      uVar15 = *(ushort *)(lVar19 + 0xa7) & 7;
      if (*(int *)(lVar5 + 0x2b64 + (ulong)uVar15 * 4) == 0) {
        if ((uVar17 & 1) == 0) {
          uVar17 = (ulong)*(byte *)(*(long *)(lVar5 + 0x2088) +
                                   (long)(*(int *)(lVar5 + 0x2090) * blk_row + blk_col));
          goto LAB_001bcd2b;
        }
      }
      else if ((uVar17 & 1) == 0) {
        uVar17 = 0;
LAB_001bcd2b:
        if ((0x18608UL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
          if (bVar21 == 0) {
            TVar24 = av1_ext_tx_set_lookup[0]
                     [(ulong)((0x60604UL >> ((ulong)tx_size & 0x3f) & 1) != 0) + (ulong)(uVar14 * 2)
                     ];
            goto LAB_001bd293;
          }
        }
        else {
          TVar24 = (TxSetType)uVar14;
LAB_001bd293:
          if (TVar24 == '\0') goto LAB_001bc6ec;
        }
        if (((0 < *(int *)(lVar30 + 0x3c1e8)) && (*(char *)(lVar19 + 0x90) == '\0')) &&
           ((*(char *)(lVar30 + 0x409b8) == '\0' ||
            ((*(byte *)(lVar30 + 0x40a3c + (ulong)uVar15 * 4) & 0x40) == 0)))) {
          uVar15 = get_ext_tx_set(tx_size,uVar14,(uint)bVar21);
          if (0 < (int)uVar15) {
            bVar23 = av1_get_ext_tx_set_type(tx_size,uVar14,(uint)bVar21);
            if (uVar14 == 0) {
              if (*(char *)(lVar19 + 0x5b) == '\0') {
                pbVar47 = (byte *)(lVar19 + 2);
              }
              else {
                pbVar47 = "" + *(byte *)(lVar19 + 0x5a);
              }
              if (cVar33 != '\0') {
                cdf = (aom_cdf_prob *)
                      (lVar31 + (ulong)bVar34 * 0x1ba + (ulong)uVar15 * 0x6e8 +
                       (ulong)*pbVar47 * 0x20 + (ulong)*pbVar47 * 2 + 0x3b42);
                goto LAB_001bd3e0;
              }
            }
            else if (cVar33 != '\0') {
              cdf = (aom_cdf_prob *)
                    (lVar31 + (ulong)uVar15 * 0x88 + (ulong)bVar34 * 0x20 + (ulong)bVar34 * 2 +
                    0x4ffa);
LAB_001bd3e0:
              update_cdf(cdf,(int8_t)av1_ext_tx_ind[bVar23][uVar17],av1_num_ext_tx_set[bVar23]);
            }
          }
        }
      }
    }
LAB_001bc6ec:
    tx_class = ""[uVar29];
    scan = scan_order->scan;
    piVar2 = (int *)((ulong)(uint)(iVar40 << 6) + lVar5 + 0x256c8 + uVar29 * 4);
    *piVar2 = *piVar2 + 1;
    if (uVar46 < 0x21) {
      pcVar18 = "" + uVar46;
    }
    else {
      uVar14 = uVar25 - 1 >> 5;
      uVar17 = 0x10;
      if (uVar14 < 0x10) {
        uVar17 = (ulong)uVar14;
      }
      pcVar18 = "\x06\a\b\b\t\t\t\t\n\n\n\n\n\n\n\n\v" + uVar17;
    }
    cVar22 = *pcVar18;
    lVar19 = (long)cVar22;
    sVar4 = av1_eob_group_start[lVar19];
    uVar29 = uVar29 - 10;
    switch(""[uVar20]) {
    case '\0':
      if (cVar33 != '\0') {
        lVar31 = lVar6 + uVar16 * 0x18;
        lVar39 = lVar31 + 0x3c6 + (ulong)(uVar29 < 6) * 0xc;
        puVar32 = (ushort *)(lVar31 + (ulong)(uVar29 < 6) * 0xc + 0x3d0);
        uVar35 = *puVar32;
        bVar23 = (char)(uVar35 >> 4) + 5;
        lVar31 = 0;
        do {
          uVar55 = *(ushort *)(lVar39 + lVar31 * 2);
          if (lVar31 < (char)(cVar22 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          else {
            sVar8 = -(uVar55 >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar39 + lVar31 * 2) = sVar8 + uVar55;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 4);
LAB_001bcc78:
        *puVar32 = *puVar32 + (ushort)(uVar35 < 0x20);
        if ((cVar33 != '\0') && (0 < av1_eob_offset_bits[lVar19])) {
          lVar31 = uVar16 * 0x36 +
                   (ulong)((uint)bVar34 + (uint)bVar3 + 1 >> 1 & 0xff) * 0x6c + lVar6 + lVar19 * 6;
          uVar35 = *(ushort *)(lVar31 + 0x178);
          bVar23 = (char)(uVar35 >> 4) + 4;
          uVar55 = *(ushort *)(lVar31 + 0x174);
          if ((uVar25 - (int)sVar4 >> ((byte)((char)av1_eob_offset_bits[lVar19] - 1) & 0x1f) & 1) ==
              0) {
            sVar4 = -(uVar55 >> (bVar23 & 0x1f));
          }
          else {
            sVar4 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar31 + 0x174) = sVar4 + uVar55;
          *(ushort *)(lVar31 + 0x178) = uVar35 + (uVar35 < 0x20);
        }
      }
      break;
    case '\x01':
      if (cVar33 != '\0') {
        lVar39 = uVar16 * 0x1c + lVar6;
        lVar31 = (ulong)(uVar29 < 6) * 0x10 + (ulong)(uVar29 < 6) * -2;
        lVar38 = lVar31 + lVar39 + 0x3f6;
        puVar32 = (ushort *)(lVar39 + lVar31 + 0x402);
        uVar35 = *puVar32;
        bVar23 = (char)(uVar35 >> 4) + 5;
        lVar31 = 0;
        do {
          uVar55 = *(ushort *)(lVar38 + lVar31 * 2);
          if (lVar31 < (char)(cVar22 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          else {
            sVar8 = -(uVar55 >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar38 + lVar31 * 2) = sVar8 + uVar55;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 5);
        goto LAB_001bcc78;
      }
      break;
    case '\x02':
      if (cVar33 != '\0') {
        lVar39 = (ulong)bVar12 * 0x20 + lVar6;
        lVar31 = (ulong)(uVar29 < 6) * 0x10;
        lVar38 = lVar31 + lVar39 + 0x42e;
        puVar32 = (ushort *)(lVar39 + lVar31 + 0x43c);
        uVar35 = *puVar32;
        bVar23 = (char)(uVar35 >> 4) + 5;
        lVar31 = 0;
        do {
          uVar55 = *(ushort *)(lVar38 + lVar31 * 2);
          if (lVar31 < (char)(cVar22 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          else {
            sVar8 = -(uVar55 >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar38 + lVar31 * 2) = sVar8 + uVar55;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 6);
        goto LAB_001bcc78;
      }
      break;
    case '\x03':
      if (cVar33 != '\0') {
        lVar31 = lVar6 + uVar16 * 0x24;
        lVar39 = lVar31 + 0x46e + (ulong)(uVar29 < 6) * 0x12;
        puVar32 = (ushort *)(lVar31 + (ulong)(uVar29 < 6) * 0x12 + 0x47e);
        uVar35 = *puVar32;
        bVar23 = (char)(uVar35 >> 4) + 5;
        lVar31 = 0;
        do {
          uVar55 = *(ushort *)(lVar39 + lVar31 * 2);
          if (lVar31 < (char)(cVar22 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          else {
            sVar8 = -(uVar55 >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar39 + lVar31 * 2) = sVar8 + uVar55;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 7);
        goto LAB_001bcc78;
      }
      break;
    case '\x04':
      if (cVar33 != '\0') {
        puVar32 = (ushort *)(lVar6 + uVar16 * 0x28 + 0x4c8 + (ulong)(uVar29 < 6) * 0x14);
        uVar35 = *puVar32;
        cVar22 = cVar22 + -1;
        auVar50._0_4_ = -(uint)('\x06' < cVar22);
        auVar50._4_4_ = -(uint)('\x06' < cVar22);
        auVar50._8_4_ = -(uint)('\a' < cVar22);
        auVar50._12_4_ = -(uint)('\a' < cVar22);
        uVar14 = (uVar35 >> 4) + 5;
        auVar60._0_4_ = -(uint)('\x04' < cVar22);
        auVar60._4_4_ = -(uint)('\x04' < cVar22);
        auVar60._8_4_ = -(uint)('\x05' < cVar22);
        auVar60._12_4_ = -(uint)('\x05' < cVar22);
        auVar50 = packssdw(auVar60,auVar50);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar52._0_4_ = -(uint)('\x02' < cVar22);
        auVar52._4_4_ = -(uint)('\x02' < cVar22);
        auVar52._8_4_ = -(uint)('\x03' < cVar22);
        auVar52._12_4_ = -(uint)('\x03' < cVar22);
        auVar49._0_4_ = -(uint)('\0' < cVar22);
        auVar49._4_4_ = -(uint)('\0' < cVar22);
        auVar49._8_4_ = -(uint)('\x01' < cVar22);
        auVar49._12_4_ = -(uint)('\x01' < cVar22);
        auVar49 = packssdw(auVar49,auVar52);
        auVar50 = packssdw(auVar49 ^ auVar62,auVar50 ^ auVar62);
        auVar49 = *(undefined1 (*) [16])(puVar32 + -9);
        uVar55 = auVar49._8_2_;
        uVar56 = auVar49._10_2_;
        uVar57 = auVar49._12_2_;
        uVar58 = auVar49._14_2_;
        uVar61 = auVar49._6_2_;
        auVar7._10_2_ = 0;
        auVar7._0_10_ = auVar49._0_10_;
        auVar7._12_2_ = uVar61;
        auVar9._8_2_ = auVar49._4_2_;
        auVar9._0_8_ = auVar49._0_8_;
        auVar9._10_4_ = auVar7._10_4_;
        auVar11._6_8_ = 0;
        auVar11._0_6_ = auVar9._8_6_;
        auVar10._4_2_ = auVar49._2_2_;
        auVar10._0_4_ = auVar49._0_4_;
        auVar10._6_8_ = SUB148(auVar11 << 0x40,6);
        uVar15 = auVar49._0_4_ & 0xffff;
        auVar62 = ZEXT416(uVar14);
        uVar20 = (ulong)uVar14;
        auVar54._0_4_ = (int)(short)(uVar55 >> uVar20);
        auVar54._4_4_ = (int)(short)(uVar56 >> uVar20);
        auVar54._8_4_ = (int)(short)(uVar57 >> uVar20);
        auVar54._12_4_ = (int)(short)(uVar58 >> uVar20);
        auVar59._0_4_ = (int)(short)(uVar15 >> uVar20);
        auVar59._4_4_ = (int)(short)(auVar10._4_4_ >> uVar20);
        auVar59._8_4_ = (int)(short)(auVar9._8_4_ >> uVar20);
        auVar59._12_4_ = (int)(short)(uVar61 >> uVar20);
        auVar60 = packssdw(auVar59,auVar54);
        auVar63._0_4_ = (int)(short)((int)(0x8000 - (uint)uVar55) >> auVar62);
        auVar63._4_4_ = (int)(short)((int)(0x8000 - (uint)uVar56) >> auVar62);
        auVar63._8_4_ = (int)(short)((int)(0x8000 - (uint)uVar57) >> auVar62);
        auVar63._12_4_ = (int)(short)((int)(0x8000 - (uint)uVar58) >> auVar62);
        auVar53._0_4_ = (int)(short)((int)(0x8000 - uVar15) >> auVar62);
        auVar53._4_4_ = (int)(short)((int)(0x8000 - auVar10._4_4_) >> auVar62);
        auVar53._8_4_ = (int)(short)((int)(0x8000 - auVar9._8_4_) >> auVar62);
        auVar53._12_4_ = (int)(short)((int)(0x8000 - (uint)uVar61) >> auVar62);
        auVar62 = packssdw(auVar53,auVar63);
        auVar51._2_2_ = -auVar60._2_2_;
        auVar51._0_2_ = -auVar60._0_2_;
        auVar51._4_2_ = -auVar60._4_2_;
        auVar51._6_2_ = -auVar60._6_2_;
        auVar51._8_2_ = -auVar60._8_2_;
        auVar51._10_2_ = -auVar60._10_2_;
        auVar51._12_2_ = -auVar60._12_2_;
        auVar51._14_2_ = -auVar60._14_2_;
        auVar50 = ~auVar50 & auVar62 | auVar51 & auVar50;
        puVar32[-9] = auVar50._0_2_ + auVar49._0_2_;
        puVar32[-8] = auVar50._2_2_ + auVar49._2_2_;
        puVar32[-7] = auVar50._4_2_ + auVar49._4_2_;
        puVar32[-6] = auVar50._6_2_ + uVar61;
        puVar32[-5] = auVar50._8_2_ + uVar55;
        puVar32[-4] = auVar50._10_2_ + uVar56;
        puVar32[-3] = auVar50._12_2_ + uVar57;
        puVar32[-2] = auVar50._14_2_ + uVar58;
        goto LAB_001bcc78;
      }
      break;
    case '\x05':
      if (cVar33 != '\0') {
        lVar39 = uVar16 * 0x2c + lVar6;
        lVar31 = (ulong)(uVar29 < 6) * 0x16;
        lVar38 = lVar39 + lVar31 + 0x506;
        puVar32 = (ushort *)(lVar39 + lVar31 + 0x51a);
        uVar35 = *puVar32;
        bVar23 = (char)(uVar35 >> 4) + 5;
        lVar31 = 0;
        do {
          uVar55 = *(ushort *)(lVar38 + lVar31 * 2);
          if (lVar31 < (char)(cVar22 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          else {
            sVar8 = -(uVar55 >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar38 + lVar31 * 2) = sVar8 + uVar55;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 9);
        goto LAB_001bcc78;
      }
      break;
    default:
      if (cVar33 != '\0') {
        lVar31 = (ulong)((uint)bVar12 * 0x30) + lVar6;
        lVar39 = lVar31 + (ulong)(uVar29 < 6) * 0x18 + 0x55e;
        puVar32 = (ushort *)(lVar31 + (ulong)(uVar29 < 6) * 0x18 + 0x574);
        uVar35 = *puVar32;
        bVar23 = (char)(uVar35 >> 4) + 5;
        lVar31 = 0;
        do {
          uVar55 = *(ushort *)(lVar39 + lVar31 * 2);
          if (lVar31 < (char)(cVar22 + -1)) {
            sVar8 = (short)((int)(0x8000 - (uint)uVar55) >> (bVar23 & 0x1f));
          }
          else {
            sVar8 = -(uVar55 >> (bVar23 & 0x1f));
          }
          *(ushort *)(lVar39 + lVar31 * 2) = sVar8 + uVar55;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 10);
        goto LAB_001bcc78;
      }
    }
    av1_get_nz_map_contexts_sse2(levels_buf,scan,uVar46,tx_size,tx_class,coeff_contexts);
    cVar22 = *(char *)(lVar30 + 0x9ae91);
    iVar40 = 1 << (local_15f4 & 0x1f);
    iVar41 = iVar40 + 4;
    uVar14 = uVar44;
    if (2 < (byte)uVar13) {
      uVar14 = 3;
    }
    uVar20 = (ulong)(uVar25 - 1);
    do {
      sVar4 = scan[uVar20];
      lVar19 = (long)coeff_contexts[sVar4];
      uVar13 = qcoeff[sVar4];
      uVar15 = -uVar13;
      if (0 < (int)uVar13) {
        uVar15 = uVar13;
      }
      if (cVar22 != '\0') {
        *(long *)(lVar5 + 0x25d30) = *(long *)(lVar5 + 0x25d30) + (ulong)uVar15;
      }
      if (cVar33 != '\0') {
        uVar29 = 3;
        if (uVar15 < 3) {
          uVar29 = (ulong)uVar15;
        }
        if (uVar20 == uVar25 - 1) {
          lVar31 = (ulong)bVar12 * 0x20 + (ulong)(uVar44 << 6) + lVar6 + 0x5be;
          lVar30 = lVar31 + lVar19 * 8;
          puVar32 = (ushort *)(lVar31 + lVar19 * 8 + 6);
          uVar46 = *puVar32;
          bVar23 = (char)(uVar46 >> 4) + 4;
          lVar19 = 0;
          do {
            uVar35 = *(ushort *)(lVar30 + lVar19 * 2);
            if (lVar19 < (long)(uVar29 - 1)) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar23 & 0x1f));
            }
            else {
              sVar8 = -(uVar35 >> (bVar23 & 0x1f));
            }
            *(ushort *)(lVar30 + lVar19 * 2) = sVar8 + uVar35;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 2);
        }
        else {
          lVar31 = uVar16 * 0x1a4 + (ulong)uVar44 * 0x348 + lVar6 + 0x6fe;
          lVar30 = lVar31 + lVar19 * 10;
          puVar32 = (ushort *)(lVar31 + lVar19 * 10 + 8);
          uVar46 = *puVar32;
          bVar23 = (char)(uVar46 >> 4) + 5;
          uVar17 = 0;
          do {
            uVar35 = *(ushort *)(lVar30 + uVar17 * 2);
            if (uVar17 < uVar29) {
              sVar8 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar23 & 0x1f));
            }
            else {
              sVar8 = -(uVar35 >> (bVar23 & 0x1f));
            }
            *(ushort *)(lVar30 + uVar17 * 2) = sVar8 + uVar35;
            uVar17 = uVar17 + 1;
          } while (uVar17 != 3);
        }
        *puVar32 = *puVar32 + (ushort)(uVar46 < 0x20);
      }
      if (2 < uVar15) {
        iVar28 = (int)sVar4 >> (local_15f4 & 0x1f);
        iVar37 = iVar28 << (local_15f4 & 0x1f);
        iVar43 = sVar4 - iVar37;
        iVar45 = iVar28 * iVar41 + iVar43;
        lVar19 = (long)(iVar45 + iVar41);
        uVar13 = (uint)levels_buf[lVar19] + (uint)levels_buf[(long)iVar45 + 1];
        if (tx_class == '\x02') {
          uVar13 = uVar13 + levels_buf[(long)iVar45 + 2] + 1 >> 1;
          if (5 < uVar13) {
            uVar13 = 6;
          }
          if (sVar4 != 0) {
            if (sVar4 != iVar37) goto LAB_001bd034;
LAB_001bd05e:
            uVar13 = uVar13 + 7;
          }
        }
        else {
          if (tx_class == '\x01') {
            uVar13 = uVar13 + levels_buf[iVar45 + iVar40 * 2 + 8] + 1 >> 1;
            if (5 < uVar13) {
              uVar13 = 6;
            }
            if (sVar4 == 0) goto LAB_001bd061;
            if (iVar28 == 0) goto LAB_001bd05e;
          }
          else if (tx_class == '\0') {
            uVar13 = uVar13 + levels_buf[lVar19 + 1] + 1 >> 1;
            if (5 < uVar13) {
              uVar13 = 6;
            }
            if (sVar4 == 0) goto LAB_001bd061;
            if ((iVar28 < 2) && (iVar43 < 2)) goto LAB_001bd05e;
          }
LAB_001bd034:
          uVar13 = uVar13 + 0xe;
        }
LAB_001bd061:
        lVar19 = (ulong)(uVar13 * 2) * 5;
        lVar30 = lVar6 + 0x1766 + (ulong)uVar14 * 0x1a4 + uVar16 * 0xd2 + lVar19;
        lVar19 = lVar19 + (ulong)uVar14 * 0x1a4 + uVar16 * 0xd2 + lVar6 + 0x1766;
        uVar13 = 0;
        do {
          iVar28 = (uVar15 - 3) - uVar13;
          if (cVar33 != '\0') {
            iVar37 = 3;
            if (iVar28 < 3) {
              iVar37 = iVar28;
            }
            uVar46 = *(ushort *)(lVar30 + 8);
            bVar23 = (char)(uVar46 >> 4) + 5;
            lVar31 = 0;
            do {
              uVar35 = *(ushort *)(lVar19 + lVar31 * 2);
              if (lVar31 < (char)iVar37) {
                sVar4 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar23 & 0x1f));
              }
              else {
                sVar4 = -(uVar35 >> (bVar23 & 0x1f));
              }
              *(ushort *)(lVar19 + lVar31 * 2) = sVar4 + uVar35;
              lVar31 = lVar31 + 1;
            } while (lVar31 != 3);
            psVar1 = (short *)(lVar30 + 8);
            *psVar1 = *psVar1 + (ushort)(uVar46 < 0x20);
          }
        } while ((2 < iVar28) && (bVar48 = uVar13 < 9, uVar13 = uVar13 + 3, bVar48));
      }
      iVar28 = (int)uVar20;
      uVar20 = uVar20 - 1;
    } while (0 < iVar28);
    qcoeff = __dest;
    if (*__dest != 0) {
      if (cVar33 != '\0') {
        lVar19 = lVar6 + uVar16 * 0x12 + (long)txb_ctx.dc_sign_ctx * 6;
        uVar46 = *(ushort *)(lVar19 + 0x3a6);
        bVar12 = (char)(uVar46 >> 4) + 4;
        uVar35 = *(ushort *)(lVar19 + 0x3a2);
        if (*__dest < 0) {
          sVar4 = (short)((int)(0x8000 - (uint)uVar35) >> (bVar12 & 0x1f));
        }
        else {
          sVar4 = -(uVar35 >> (bVar12 & 0x1f));
        }
        *(ushort *)(lVar19 + 0x3a2) = uVar35 + sVar4;
        *(ushort *)(lVar19 + 0x3a6) = uVar46 + (uVar46 < 0x20);
      }
      pbVar47 = (byte *)(lVar36 + lVar42);
      *pbVar47 = *pbVar47 | (char)txb_ctx.dc_sign_ctx << 4;
    }
  }
  bVar12 = av1_get_txb_entropy_context(qcoeff,scan_order,uVar25);
  uVar25 = (uint)bVar12;
LAB_001bd1fb:
  av1_set_entropy_contexts
            ((MACROBLOCKD *)(lVar5 + 0x1a0),(macroblockd_plane *)(lVar27 + 0x1b0),plane,plane_bsize,
             tx_size,uVar25,blk_col,blk_row);
  return;
}

Assistant:

void av1_update_and_record_txb_context(int plane, int block, int blk_row,
                                       int blk_col, BLOCK_SIZE plane_bsize,
                                       TX_SIZE tx_size, void *arg) {
  struct tokenize_b_args *const args = arg;
  const AV1_COMP *cpi = args->cpi;
  const AV1_COMMON *cm = &cpi->common;
  ThreadData *const td = args->td;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  const int eob = p->eobs[block];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  const PLANE_TYPE plane_type = pd->plane_type;
  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  tran_low_t *tcoeff;
  assert(args->dry_run != DRY_RUN_COSTCOEFFS);
  if (args->dry_run == OUTPUT_ENABLED) {
    MB_MODE_INFO *mbmi = xd->mi[0];
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, plane,
                pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row, &txb_ctx);
    const int bhl = get_txb_bhl(tx_size);
    const int width = get_txb_wide(tx_size);
    const int height = get_txb_high(tx_size);
    const uint8_t allow_update_cdf = args->allow_update_cdf;
    const TX_SIZE txsize_ctx = get_txsize_entropy_ctx(tx_size);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
#if CONFIG_ENTROPY_STATS
    int cdf_idx = cm->coef_cdf_category;
    ++td->counts->txb_skip[cdf_idx][txsize_ctx][txb_ctx.txb_skip_ctx][eob == 0];
#endif  // CONFIG_ENTROPY_STATS
    if (allow_update_cdf) {
      update_cdf(ec_ctx->txb_skip_cdf[txsize_ctx][txb_ctx.txb_skip_ctx],
                 eob == 0, 2);
    }

    CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
    const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                           (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
    uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
    uint8_t *const entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
    entropy_ctx[block] = txb_ctx.txb_skip_ctx;
    eob_txb[block] = eob;

    if (eob == 0) {
      av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, 0, blk_col,
                               blk_row);
      return;
    }
    const int segment_id = mbmi->segment_id;
    const int seg_eob = av1_get_tx_eob(&cpi->common.seg, segment_id, tx_size);
    tran_low_t *tcoeff_txb =
        cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
    tcoeff = tcoeff_txb + block_offset;
    memcpy(tcoeff, qcoeff, sizeof(*tcoeff) * seg_eob);

    uint8_t levels_buf[TX_PAD_2D];
    uint8_t *const levels = set_levels(levels_buf, height);
    av1_txb_init_levels(tcoeff, width, height, levels);
    update_tx_type_count(cpi, cm, xd, blk_row, blk_col, plane, tx_size,
                         td->counts, allow_update_cdf);

    const TX_CLASS tx_class = tx_type_to_class[tx_type];
    const int16_t *const scan = scan_order->scan;

    // record tx type usage
    td->rd_counts.tx_type_used[tx_size][tx_type]++;

#if CONFIG_ENTROPY_STATS
    update_eob_context(cdf_idx, eob, tx_size, tx_class, plane_type, ec_ctx,
                       td->counts, allow_update_cdf);
#else
    update_eob_context(eob, tx_size, tx_class, plane_type, ec_ctx,
                       allow_update_cdf);
#endif

    DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
    av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class,
                            coeff_contexts);

    for (int c = eob - 1; c >= 0; --c) {
      const int pos = scan[c];
      const int coeff_ctx = coeff_contexts[pos];
      const tran_low_t v = qcoeff[pos];
      const tran_low_t level = abs(v);
      /* abs_sum_level is needed to decide the job scheduling order of
       * pack bitstream multi-threading. This data is not needed if
       * multi-threading is disabled. */
      if (cpi->mt_info.pack_bs_mt_enabled) td->abs_sum_level += level;

      if (allow_update_cdf) {
        if (c == eob - 1) {
          assert(coeff_ctx < 4);
          update_cdf(
              ec_ctx->coeff_base_eob_cdf[txsize_ctx][plane_type][coeff_ctx],
              AOMMIN(level, 3) - 1, 3);
        } else {
          update_cdf(ec_ctx->coeff_base_cdf[txsize_ctx][plane_type][coeff_ctx],
                     AOMMIN(level, 3), 4);
        }
      }
      if (c == eob - 1) {
        assert(coeff_ctx < 4);
#if CONFIG_ENTROPY_STATS
        ++td->counts->coeff_base_eob_multi[cdf_idx][txsize_ctx][plane_type]
                                          [coeff_ctx][AOMMIN(level, 3) - 1];
      } else {
        ++td->counts->coeff_base_multi[cdf_idx][txsize_ctx][plane_type]
                                      [coeff_ctx][AOMMIN(level, 3)];
#endif
      }
      if (level > NUM_BASE_LEVELS) {
        const int base_range = level - 1 - NUM_BASE_LEVELS;
        const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
        for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
          const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
          if (allow_update_cdf) {
            update_cdf(ec_ctx->coeff_br_cdf[AOMMIN(txsize_ctx, TX_32X32)]
                                           [plane_type][br_ctx],
                       k, BR_CDF_SIZE);
          }
          for (int lps = 0; lps < BR_CDF_SIZE - 1; lps++) {
#if CONFIG_ENTROPY_STATS
            ++td->counts->coeff_lps[AOMMIN(txsize_ctx, TX_32X32)][plane_type]
                                   [lps][br_ctx][lps == k];
#endif  // CONFIG_ENTROPY_STATS
            if (lps == k) break;
          }
#if CONFIG_ENTROPY_STATS
          ++td->counts->coeff_lps_multi[cdf_idx][AOMMIN(txsize_ctx, TX_32X32)]
                                       [plane_type][br_ctx][k];
#endif
          if (k < BR_CDF_SIZE - 1) break;
        }
      }
    }
    // Update the context needed to code the DC sign (if applicable)
    if (tcoeff[0] != 0) {
      const int dc_sign = (tcoeff[0] < 0) ? 1 : 0;
      const int dc_sign_ctx = txb_ctx.dc_sign_ctx;
#if CONFIG_ENTROPY_STATS
      ++td->counts->dc_sign[plane_type][dc_sign_ctx][dc_sign];
#endif  // CONFIG_ENTROPY_STATS
      if (allow_update_cdf)
        update_cdf(ec_ctx->dc_sign_cdf[plane_type][dc_sign_ctx], dc_sign, 2);
      entropy_ctx[block] |= dc_sign_ctx << DC_SIGN_CTX_SHIFT;
    }
  } else {
    tcoeff = qcoeff;
  }
  const uint8_t cul_level =
      av1_get_txb_entropy_context(tcoeff, scan_order, eob);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level,
                           blk_col, blk_row);
}